

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaLib.cpp
# Opt level: O2

string * __thiscall
xmrig::CudaLib::version_abi_cxx11_(string *__return_storage_ptr__,CudaLib *this,uint32_t version)

{
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  std::__cxx11::to_string(&local_38,(uint)(((ulong)this & 0xffffffff) / 1000));
  std::operator+(&local_58,&local_38,".");
  std::__cxx11::to_string(&sStack_78,(ushort)(((ulong)this & 0xffffffff) % 1000) / 10);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_78);
  std::__cxx11::string::~string((string *)&sStack_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string xmrig::CudaLib::version(uint32_t version)
{
    return std::to_string(version / 1000) + "." + std::to_string((version % 1000) / 10);
}